

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  TestProperty *pTVar2;
  int i;
  long in_FS_OFFSET;
  string kProperty;
  string kProperties;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  allocator<char> local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"properties",local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"property",(allocator<char> *)&local_98);
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    poVar1 = std::operator<<(stream,"<");
    poVar1 = std::operator<<(poVar1,local_58);
    std::operator<<(poVar1,">\n");
    for (i = 0; i < (int)((ulong)((long)(result->test_properties_).
                                        super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(result->test_properties_).
                                       super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 6); i = i + 1)
    {
      pTVar2 = TestResult::GetTestProperty(result,i);
      poVar1 = std::operator<<(stream,"<");
      std::operator<<(poVar1,(string *)local_78);
      poVar1 = std::operator<<(stream," name=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,(pTVar2->key_)._M_dataplus._M_p,&local_b9);
      EscapeXmlAttribute(&local_98,&local_b8);
      poVar1 = std::operator<<(poVar1,(string *)&local_98);
      std::operator<<(poVar1,"\"");
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      poVar1 = std::operator<<(stream," value=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,(pTVar2->value_)._M_dataplus._M_p,&local_b9);
      EscapeXmlAttribute(&local_98,&local_b8);
      poVar1 = std::operator<<(poVar1,(string *)&local_98);
      std::operator<<(poVar1,"\"");
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::operator<<(stream,"/>\n");
    }
    poVar1 = std::operator<<(stream,"</");
    poVar1 = std::operator<<(poVar1,local_58);
    std::operator<<(poVar1,">\n");
  }
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "<" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "<" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "</" << kProperties << ">\n";
}